

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Orientation.h
# Opt level: O1

void __thiscall
DIS::MinefieldStatePdu::setMinefieldOrientation(MinefieldStatePdu *this,Orientation *pX)

{
  float fVar1;
  
  (this->_minefieldOrientation)._phi = pX->_phi;
  fVar1 = pX->_theta;
  (this->_minefieldOrientation)._psi = pX->_psi;
  (this->_minefieldOrientation)._theta = fVar1;
  return;
}

Assistant:

class OPENDIS6_EXPORT Orientation
{
protected:
  float _psi; 

  float _theta; 

  float _phi; 


 public:
    Orientation();
    virtual ~Orientation();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getPsi() const; 
    void setPsi(float pX); 

    float getTheta() const; 
    void setTheta(float pX); 

    float getPhi() const; 
    void setPhi(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const Orientation& rhs) const;
}